

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

tbx_t * tbx_index_load(char *fn)

{
  uint32_t uVar1;
  hts_idx_t *phVar2;
  uint8_t *puVar3;
  size_t sVar4;
  int local_5c;
  int l_nm;
  int l_meta;
  uint32_t x [7];
  char *p;
  char *nm;
  uint8_t *meta;
  tbx_t *tbx;
  char *fn_local;
  
  fn_local = (char *)calloc(1,0x28);
  phVar2 = hts_idx_load(fn,2);
  ((tbx_t *)fn_local)->idx = phVar2;
  if (((tbx_t *)fn_local)->idx == (hts_idx_t *)0x0) {
    free(fn_local);
    fn_local = (char *)0x0;
  }
  else {
    puVar3 = hts_idx_get_meta(((tbx_t *)fn_local)->idx,&local_5c);
    if (puVar3 == (uint8_t *)0x0) {
      free(fn_local);
      fn_local = (char *)0x0;
    }
    else {
      _l_nm = *(undefined8 *)puVar3;
      x._0_8_ = *(undefined8 *)(puVar3 + 8);
      x._8_8_ = *(undefined8 *)(puVar3 + 0x10);
      uVar1 = *(uint32_t *)(puVar3 + 0x18);
      (((tbx_t *)fn_local)->conf).preset = (int)_l_nm;
      (((tbx_t *)fn_local)->conf).sc = (int)((ulong)_l_nm >> 0x20);
      (((tbx_t *)fn_local)->conf).bc = (uint32_t)x._0_8_;
      (((tbx_t *)fn_local)->conf).ec = SUB84(x._0_8_,4);
      (((tbx_t *)fn_local)->conf).meta_char = (uint32_t)x._8_8_;
      (((tbx_t *)fn_local)->conf).line_skip = SUB84(x._8_8_,4);
      x[4] = uVar1;
      for (unique0x1000016c = puVar3 + 0x1c;
          (long)stack0xffffffffffffffc8 - (long)(puVar3 + 0x1c) < (long)(int)uVar1;
          register0x00000000 = stack0xffffffffffffffc8 + sVar4 + 1) {
        get_tid((tbx_t *)fn_local,(char *)stack0xffffffffffffffc8,1);
        sVar4 = strlen((char *)stack0xffffffffffffffc8);
      }
    }
  }
  return (tbx_t *)fn_local;
}

Assistant:

tbx_t *tbx_index_load(const char *fn)
{
    tbx_t *tbx;
    uint8_t *meta;
    char *nm, *p;
    uint32_t x[7];
    int l_meta, l_nm;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->idx = hts_idx_load(fn, HTS_FMT_TBI);
    if ( !tbx->idx )
    {
        free(tbx);
        return NULL;
    }
    meta = hts_idx_get_meta(tbx->idx, &l_meta);
    if ( !meta )
    {
        free(tbx);
        return NULL;
    }
    memcpy(x, meta, 28);
    memcpy(&tbx->conf, x, 24);
    p = nm = (char*)meta + 28;
    l_nm = x[6];
    for (; p - nm < l_nm; p += strlen(p) + 1) get_tid(tbx, p, 1);
    return tbx;
}